

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O3

bool __thiscall
duckdb::QuantileCompare<duckdb::MadAccessor<duckdb::dtime_t,_duckdb::interval_t,_duckdb::dtime_t>_>
::operator()(QuantileCompare<duckdb::MadAccessor<duckdb::dtime_t,_duckdb::interval_t,_duckdb::dtime_t>_>
             *this,INPUT_TYPE *lhs,INPUT_TYPE *rhs)

{
  OutOfRangeException *this_00;
  bool bVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  bool bVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  string local_50;
  
  lVar3 = lhs->micros - this->accessor_l->median->micros;
  if (lVar3 < 1) {
    lVar3 = -lVar3;
  }
  auVar10 = duckdb::Interval::FromMicro(lVar3);
  lVar4 = auVar10._8_8_;
  lVar3 = rhs->micros - this->accessor_r->median->micros;
  if (lVar3 == -0x8000000000000000) {
    this_00 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Overflow on abs(%d)","");
    OutOfRangeException::OutOfRangeException<long>(this_00,&local_50,-0x8000000000000000);
    __cxa_throw(this_00,&OutOfRangeException::typeinfo,std::runtime_error::~runtime_error);
  }
  lVar6 = -lVar3;
  if (0 < lVar3) {
    lVar6 = lVar3;
  }
  auVar11 = duckdb::Interval::FromMicro(lVar6);
  lVar6 = auVar11._8_8_;
  lVar5 = auVar10._0_8_ >> 0x20;
  lVar3 = auVar11._0_8_ >> 0x20;
  if (this->desc == true) {
    lVar5 = lVar5 + lVar4 / 86400000000;
    lVar7 = (long)auVar10._0_4_ + lVar5 / 0x1e;
    lVar3 = lVar3 + lVar6 / 86400000000;
    lVar2 = (long)auVar11._0_4_ + lVar3 / 0x1e;
    if (lVar2 < lVar7) {
      return true;
    }
    if (lVar7 < lVar2) {
      return false;
    }
    lVar4 = lVar4 % 86400000000;
    lVar5 = lVar5 % 0x1e;
    lVar6 = lVar6 % 86400000000;
    lVar3 = lVar3 % 0x1e;
    if (lVar3 < lVar5) {
      return true;
    }
    bVar1 = lVar3 <= lVar5;
    bVar9 = SBORROW8(lVar4,lVar6);
    lVar3 = lVar4 - lVar6;
    bVar8 = lVar4 == lVar6;
  }
  else {
    lVar3 = lVar3 + lVar6 / 86400000000;
    lVar2 = (long)auVar11._0_4_ + lVar3 / 0x1e;
    lVar5 = lVar5 + lVar4 / 86400000000;
    lVar7 = (long)auVar10._0_4_ + lVar5 / 0x1e;
    if (lVar7 < lVar2) {
      return true;
    }
    if (lVar2 < lVar7) {
      return false;
    }
    lVar6 = lVar6 % 86400000000;
    lVar3 = lVar3 % 0x1e;
    lVar4 = lVar4 % 86400000000;
    lVar5 = lVar5 % 0x1e;
    if (lVar5 < lVar3) {
      return true;
    }
    bVar1 = lVar5 <= lVar3;
    bVar9 = SBORROW8(lVar6,lVar4);
    lVar3 = lVar6 - lVar4;
    bVar8 = lVar6 == lVar4;
  }
  return (bool)((!bVar8 && bVar9 == lVar3 < 0) & bVar1);
}

Assistant:

inline bool operator()(const INPUT_TYPE &lhs, const INPUT_TYPE &rhs) const {
		const auto lval = accessor_l(lhs);
		const auto rval = accessor_r(rhs);

		return desc ? (rval < lval) : (lval < rval);
	}